

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

ServiceServerLinkPtr __thiscall
miniros::ServiceManager::createServiceServerLink
          (ServiceManager *this,string *service,bool persistent,string *request_md5sum,
          string *response_md5sum,M_string *header_values)

{
  pthread_mutex_t *ppVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  socklen_t __len;
  _Any_data *header_func;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *__mutex;
  undefined8 uVar5;
  ServiceServerLinkPtr SVar6;
  bool persistent_local;
  pthread_mutex_t *local_c0;
  uint32_t serv_port;
  undefined8 local_b0;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  __shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string serv_host;
  
  persistent_local = SUB81(request_md5sum,0);
  __mutex = (pthread_mutex_t *)&service[4]._M_string_length;
  std::recursive_mutex::lock((recursive_mutex *)&__mutex->__data);
  if (*(char *)&service[4]._M_dataplus._M_p == '\x01') {
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (this->service_publications_).
    super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  }
  else {
    serv_host._M_dataplus._M_p = (pointer)&serv_host.field_2;
    serv_host._M_string_length = 0;
    serv_host.field_2._M_local_buf[0] = '\0';
    bVar3 = lookupService((ServiceManager *)service,
                          (string *)CONCAT71(in_register_00000011,persistent),&serv_host,&serv_port)
    ;
    if (bVar3) {
      local_88._M_unused._0_8_ = (undefined8)service[5].field_2._M_allocated_capacity;
      local_c0 = __mutex;
      std::make_shared<miniros::TransportTCP,miniros::PollSet*>((PollSet **)&transport);
      std::make_shared<miniros::Connection>();
      ConnectionManager::addConnection((ConnectionManager *)service[6]._M_dataplus._M_p,&connection)
      ;
      local_b0 = (string *)CONCAT71(in_register_00000011,persistent);
      std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::TransportTCP,void>
                (local_60,&transport.
                           super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>);
      header_func = &local_88;
      local_78 = 0;
      uStack_70 = 0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      Connection::initialize
                (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(TransportPtr *)local_60,false,(HeaderReceivedFunc *)header_func);
      __len = (socklen_t)header_func;
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      __mutex = local_c0;
      iVar4 = TransportTCP::connect
                        (transport.
                         super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(int)&serv_host,(sockaddr *)(ulong)serv_port,__len);
      uVar5 = local_b0;
      if ((char)iVar4 == '\0') {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (createServiceServerLink::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_88._M_pod_data,"miniros.service_manager",
                     (allocator<char> *)local_60);
          console::initializeLogLocation(&createServiceServerLink::loc,(string *)&local_88,Debug);
          std::__cxx11::string::~string((string *)local_88._M_pod_data);
          __mutex = local_c0;
          uVar5 = local_b0;
        }
        if (createServiceServerLink::loc.level_ != Debug) {
          console::setLogLocationLevel(&createServiceServerLink::loc,Debug);
          console::checkLogLocationEnabled(&createServiceServerLink::loc);
        }
        ppVar1 = local_c0;
        if (createServiceServerLink::loc.logger_enabled_ == true) {
          pcVar2 = (((string *)uVar5)->_M_dataplus)._M_p;
          console::print((FilterBase *)0x0,createServiceServerLink::loc.logger_,
                         createServiceServerLink::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                         ,0x10a,
                         "ServiceServerLinkPtr miniros::ServiceManager::createServiceServerLink(const std::string &, bool, const std::string &, const std::string &, const M_string &)"
                         ,"Failed to connect to service [%s] (mapped=[%s]) at [%s:%d]",pcVar2,pcVar2
                         ,serv_host._M_dataplus._M_p,(ulong)serv_port);
          __mutex = ppVar1;
        }
        (this->service_publications_).
        super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        (this->service_publications_).
        super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      }
      else {
        std::
        make_shared<miniros::ServiceServerLink,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (bool *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &persistent_local,response_md5sum,header_values);
        ppVar1 = (pthread_mutex_t *)((long)&service[2].field_2 + 8);
        std::mutex::lock((mutex *)&ppVar1->__data);
        std::__cxx11::
        list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
        ::push_back((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                     *)(service + 2),(value_type *)this);
        pthread_mutex_unlock(ppVar1);
        ServiceServerLink::initialize
                  ((ServiceServerLink *)
                   (this->service_publications_).
                   super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next,&connection);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      (this->service_publications_).
      super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      (this->service_publications_).
      super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    }
    std::__cxx11::string::~string((string *)&serv_host);
  }
  pthread_mutex_unlock(__mutex);
  SVar6.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  SVar6.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServiceServerLinkPtr)
         SVar6.super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceServerLinkPtr ServiceManager::createServiceServerLink(const std::string& service, bool persistent,
                                             const std::string& request_md5sum, const std::string& response_md5sum,
                                             const M_string& header_values)
{

  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return ServiceServerLinkPtr();
  }

  uint32_t serv_port;
  std::string serv_host;
  if (!lookupService(service, serv_host, serv_port))
  {
    return ServiceServerLinkPtr();
  }

  TransportTCPPtr transport(std::make_shared<TransportTCP>(&poll_manager_->getPollSet()));

  // Make sure to initialize the connection *before* transport->connect()
  // is called, otherwise we might miss a connect error (see #434).
  ConnectionPtr connection(std::make_shared<Connection>());
  connection_manager_->addConnection(connection);
  connection->initialize(transport, false, HeaderReceivedFunc());

  if (transport->connect(serv_host, serv_port))
  {
    ServiceServerLinkPtr client(std::make_shared<ServiceServerLink>(service, persistent, request_md5sum, response_md5sum, header_values));

    {
      std::scoped_lock<std::mutex> lock(service_server_links_mutex_);
      service_server_links_.push_back(client);
    }

    client->initialize(connection);

    return client;
  }

  MINIROS_DEBUG("Failed to connect to service [%s] (mapped=[%s]) at [%s:%d]", service.c_str(), service.c_str(), serv_host.c_str(), serv_port);

  return ServiceServerLinkPtr();
}